

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::SPxDevexPR<double>::selectEnterSparseCoDim
          (SPxDevexPR<double> *this,double *best,double feastol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  SPxSolverBase<double> *this_00;
  pointer pdVar6;
  pointer pdVar7;
  int *piVar8;
  SPxId SVar9;
  DataKey DVar10;
  int i;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  
  this_00 = (this->super_SPxPricer<double>).thesolver;
  pdVar6 = (this_00->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this_00->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = (ulong)(uint)(this_00->infeasibilitiesCo).super_IdxSet.num;
  i = -1;
LAB_001cc8ae:
  dVar1 = *best;
  uVar12 = uVar11 & 0xffffffff;
  do {
    uVar11 = uVar11 - 1;
    if ((int)uVar12 < 1) {
      if (-1 < i) {
        SVar9 = SPxSolverBase<double>::id(this_00,i);
        return (SPxId)SVar9.super_DataKey;
      }
      DVar10.info = 0;
      DVar10.idx = -1;
      return (SPxId)DVar10;
    }
    piVar8 = (this_00->infeasibilitiesCo).super_IdxSet.idx;
    iVar4 = piVar8[uVar11];
    dVar2 = pdVar6[iVar4];
    if (-feastol <= dVar2) {
      iVar5 = (this_00->infeasibilitiesCo).super_IdxSet.num;
      (this_00->infeasibilitiesCo).super_IdxSet.num = iVar5 + -1;
      piVar8[uVar11] = piVar8[(long)iVar5 + -1];
      (this_00->isInfeasibleCo).data[iVar4] = 0;
    }
    else {
      dVar3 = pdVar7[iVar4];
      dVar13 = feastol;
      if (feastol <= dVar3) {
        dVar13 = dVar3;
      }
      dVar13 = (dVar2 * dVar2) / dVar13;
      if (dVar1 < dVar13) break;
    }
    uVar12 = (ulong)((int)uVar12 - 1);
  } while( true );
  *best = dVar13;
  this->last = pdVar7[iVar4];
  i = iVar4;
  goto LAB_001cc8ae;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterSparseCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int enterIdx = -1;
   int idx;
   R x;

   assert(this->thesolver->weights.dim() == this->thesolver->test().dim());

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}